

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ustar.c
# Opt level: O0

int archive_write_ustar_header(archive_write *a,archive_entry *entry)

{
  long *plVar1;
  mode_t mVar2;
  archive_string_conv *paVar3;
  char *pcVar4;
  archive_entry *__s;
  size_t sVar5;
  void *_p;
  int64_t iVar6;
  archive_entry *in_RSI;
  archive *in_RDI;
  archive_string as;
  size_t path_length;
  char *p;
  archive_string_conv *sconv;
  archive_entry *entry_main;
  ustar *ustar;
  int ret2;
  int ret;
  char buff [512];
  archive_entry *in_stack_fffffffffffffd98;
  archive_entry *in_stack_fffffffffffffda0;
  archive_string *paVar7;
  size_t n;
  archive_entry *as_00;
  int local_21c;
  archive_string_conv *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  archive_entry *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  archive_write *in_stack_fffffffffffffe48;
  int local_4;
  
  plVar1 = *(long **)&in_RDI[1].current_codepage;
  if ((plVar1[2] == 0) && ((int)plVar1[4] == 0)) {
    paVar3 = archive_string_default_conversion_for_write(in_RDI);
    plVar1[3] = (long)paVar3;
    *(undefined4 *)(plVar1 + 4) = 1;
  }
  pcVar4 = archive_entry_pathname(in_stack_fffffffffffffd98);
  if (pcVar4 == (char *)0x0) {
    archive_set_error(in_RDI,-1,"Can\'t record entry in tar file without pathname");
    local_4 = -0x19;
  }
  else {
    pcVar4 = archive_entry_hardlink(in_stack_fffffffffffffd98);
    if (((pcVar4 != (char *)0x0) ||
        (pcVar4 = archive_entry_symlink(in_stack_fffffffffffffd98), pcVar4 != (char *)0x0)) ||
       (mVar2 = archive_entry_filetype(in_RSI), mVar2 != 0x8000)) {
      archive_entry_set_size(in_RSI,0);
    }
    mVar2 = archive_entry_filetype(in_RSI);
    if (((mVar2 == 0x4000) &&
        (__s = (archive_entry *)archive_entry_pathname(in_stack_fffffffffffffd98),
        __s != (archive_entry *)0x0)) &&
       (as_00 = __s, sVar5 = strlen((char *)__s), in_stack_fffffffffffffd98 = __s,
       *(char *)((long)__s + (sVar5 - 1)) != '/')) {
      in_stack_fffffffffffffda0 = (archive_entry *)0x0;
      paVar7 = (archive_string *)0x0;
      n = 0;
      _p = (void *)strlen((char *)as_00);
      paVar7 = archive_string_ensure(paVar7,(size_t)in_stack_fffffffffffffda0);
      if (paVar7 == (archive_string *)0x0) {
        archive_set_error(in_RDI,0xc,"Can\'t allocate ustar data");
        archive_string_free((archive_string *)0x2b6f3d);
        return -0x1e;
      }
      archive_strncat((archive_string *)as_00,_p,n);
      archive_strappend_char((archive_string *)in_stack_fffffffffffffda0,(char)((ulong)__s >> 0x38))
      ;
      archive_entry_copy_pathname(in_stack_fffffffffffffda0,(char *)__s);
      archive_string_free((archive_string *)0x2b6f95);
      in_stack_fffffffffffffd98 = __s;
    }
    local_21c = __archive_write_format_header_ustar
                          (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                           in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                           in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_4 = local_21c;
    if ((-0x15 < local_21c) &&
       (local_4 = __archive_write_output
                            ((archive_write *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                             0x2b700e), -0x15 < local_4)) {
      if (local_4 < local_21c) {
        local_21c = local_4;
      }
      iVar6 = archive_entry_size(in_RSI);
      *plVar1 = iVar6;
      plVar1[1] = -*plVar1 & 0x1ff;
      local_4 = local_21c;
    }
  }
  return local_4;
}

Assistant:

static int
archive_write_ustar_header(struct archive_write *a, struct archive_entry *entry)
{
	char buff[512];
	int ret, ret2;
	struct ustar *ustar;
	struct archive_entry *entry_main;
	struct archive_string_conv *sconv;

	ustar = (struct ustar *)a->format_data;

	/* Setup default string conversion. */
	if (ustar->opt_sconv == NULL) {
		if (!ustar->init_default_conversion) {
			ustar->sconv_default =
			    archive_string_default_conversion_for_write(&(a->archive));
			ustar->init_default_conversion = 1;
		}
		sconv = ustar->sconv_default;
	} else
		sconv = ustar->opt_sconv;

	/* Sanity check. */
	if (archive_entry_pathname(entry) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Can't record entry in tar file without pathname");
		return (ARCHIVE_FAILED);
	}

	/* Only regular files (not hardlinks) have data. */
	if (archive_entry_hardlink(entry) != NULL ||
	    archive_entry_symlink(entry) != NULL ||
	    !(archive_entry_filetype(entry) == AE_IFREG))
		archive_entry_set_size(entry, 0);

	if (AE_IFDIR == archive_entry_filetype(entry)) {
		const char *p;
		size_t path_length;
		/*
		 * Ensure a trailing '/'.  Modify the entry so
		 * the client sees the change.
		 */
#if defined(_WIN32) && !defined(__CYGWIN__)
		const wchar_t *wp;

		wp = archive_entry_pathname_w(entry);
		if (wp != NULL && wp[wcslen(wp) -1] != L'/') {
			struct archive_wstring ws;

			archive_string_init(&ws);
			path_length = wcslen(wp);
			if (archive_wstring_ensure(&ws,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate ustar data");
				archive_wstring_free(&ws);
				return(ARCHIVE_FATAL);
			}
			/* Should we keep '\' ? */
			if (wp[path_length -1] == L'\\')
				path_length--;
			archive_wstrncpy(&ws, wp, path_length);
			archive_wstrappend_wchar(&ws, L'/');
			archive_entry_copy_pathname_w(entry, ws.s);
			archive_wstring_free(&ws);
			p = NULL;
		} else
#endif
			p = archive_entry_pathname(entry);
		/*
		 * On Windows, this is a backup operation just in
		 * case getting WCS failed. On POSIX, this is a
		 * normal operation.
		 */
		if (p != NULL && p[strlen(p) - 1] != '/') {
			struct archive_string as;

			archive_string_init(&as);
			path_length = strlen(p);
			if (archive_string_ensure(&as,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate ustar data");
				archive_string_free(&as);
				return(ARCHIVE_FATAL);
			}
#if defined(_WIN32) && !defined(__CYGWIN__)
			/* NOTE: This might break the pathname
			 * if the current code page is CP932 and
			 * the pathname includes a character '\'
			 * as a part of its multibyte pathname. */
			if (p[strlen(p) -1] == '\\')
				path_length--;
			else
#endif
			archive_strncpy(&as, p, path_length);
			archive_strappend_char(&as, '/');
			archive_entry_copy_pathname(entry, as.s);
			archive_string_free(&as);
		}
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pahtname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif
	ret = __archive_write_format_header_ustar(a, buff, entry, -1, 1, sconv);
	if (ret < ARCHIVE_WARN) {
		if (entry_main)
			archive_entry_free(entry_main);
		return (ret);
	}
	ret2 = __archive_write_output(a, buff, 512);
	if (ret2 < ARCHIVE_WARN) {
		if (entry_main)
			archive_entry_free(entry_main);
		return (ret2);
	}
	if (ret2 < ret)
		ret = ret2;

	ustar->entry_bytes_remaining = archive_entry_size(entry);
	ustar->entry_padding = 0x1ff & (-(int64_t)ustar->entry_bytes_remaining);
	if (entry_main)
		archive_entry_free(entry_main);
	return (ret);
}